

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttr.cpp
# Opt level: O2

int OpCodeAttr::GetOpCodeDebugAttributes(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 *puVar4;
  int *piVar5;
  undefined1 *puVar6;
  
  if (op < InvalidOpCode) {
    uVar3 = (ulong)op;
    puVar6 = OpcodeDebugAttributes;
  }
  else {
    if (Decr_Num_A < op) {
      if (0x328 < op - 0x18a) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                           ,0x10e,
                           "(opIndex < (sizeof(*__countof_helper(BackendOpCodeDebugAttributes)) + 0))"
                           ,
                           "opIndex < (sizeof(*__countof_helper(BackendOpCodeDebugAttributes)) + 0)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      piVar5 = (int *)(BackendOpCodeDebugAttributes + (ulong)(op - 0x18a) * 4);
      goto LAB_00747461;
    }
    uVar3 = (ulong)(op - 0x100);
    puVar6 = ExtendedOpcodeDebugAttributes;
  }
  piVar5 = (int *)(puVar6 + uVar3 * 4);
LAB_00747461:
  return *piVar5;
}

Assistant:

static const int GetOpCodeDebugAttributes(Js::OpCode op)
{
    if (op <= Js::OpCode::MaxByteSizedOpcodes)
    {
        AnalysisAssert(op < _countof(OpcodeDebugAttributes));
        return OpcodeDebugAttributes[(int)op];
    }
    else if (op < Js::OpCode::ByteCodeLast)
    {
        uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeDebugAttributes));
        return ExtendedOpcodeDebugAttributes[opIndex];
    }
    uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
    AnalysisAssert(opIndex < _countof(BackendOpCodeDebugAttributes));
    return BackendOpCodeDebugAttributes[opIndex];
}